

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5s.hpp
# Opt level: O1

void __thiscall trng::mrg5s::backward(mrg5s *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int32_t iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  
  iVar7 = (this->P).a[4];
  if (iVar7 == 0) {
    iVar7 = (this->P).a[3];
    if (iVar7 != 0) {
      lVar8 = (long)(this->S).r[1] * (long)(this->P).a[0];
      auVar2 = SEXT816(lVar8) * SEXT816(0x2000161c4f46fb7f);
      iVar5 = (((int)(auVar2._8_8_ >> 0x1c) - (auVar2._12_4_ >> 0x1f)) * 0x7fffa78f - (int)lVar8) +
              (this->S).r[0];
      iVar4 = iVar5 + 0x7fffa78f;
      if (-1 < iVar5) {
        iVar4 = iVar5;
      }
      lVar8 = (long)(this->S).r[2] * (long)(this->P).a[1];
      auVar2 = SEXT816(lVar8) * SEXT816(0x2000161c4f46fb7f);
      iVar4 = (((int)(auVar2._8_8_ >> 0x1c) - (auVar2._12_4_ >> 0x1f)) * 0x7fffa78f - (int)lVar8) +
              iVar4;
      iVar5 = iVar4 + 0x7fffa78f;
      if (-1 < iVar4) {
        iVar5 = iVar4;
      }
      iVar4 = (this->P).a[2];
LAB_00204dbe:
      iVar1 = (this->S).r[3];
      goto LAB_00204dc2;
    }
    iVar7 = (this->P).a[2];
    if (iVar7 != 0) {
      lVar8 = (long)(this->S).r[2] * (long)(this->P).a[0];
      auVar2 = SEXT816(lVar8) * SEXT816(0x2000161c4f46fb7f);
      iVar4 = (((int)(auVar2._8_8_ >> 0x1c) - (auVar2._12_4_ >> 0x1f)) * 0x7fffa78f - (int)lVar8) +
              (this->S).r[1];
      iVar5 = iVar4 + 0x7fffa78f;
      if (-1 < iVar4) {
        iVar5 = iVar4;
      }
      iVar4 = (this->P).a[1];
      goto LAB_00204dbe;
    }
    iVar7 = (this->P).a[1];
    if (iVar7 != 0) {
      lVar8 = (long)(this->S).r[3] * (long)(this->P).a[0];
      auVar2 = SEXT816(lVar8) * SEXT816(0x2000161c4f46fb7f);
      iVar5 = (((int)(auVar2._8_8_ >> 0x1c) - (auVar2._12_4_ >> 0x1f)) * 0x7fffa78f - (int)lVar8) +
              (this->S).r[2];
      goto LAB_00204de7;
    }
    iVar6 = (this->P).a[0];
    if (iVar6 == 0) {
      iVar7 = 0;
      goto LAB_00204e1b;
    }
    iVar7 = (this->S).r[3];
    iVar6 = int_math::modulo_inverse(iVar6,0x7fffa78f);
    lVar8 = (long)iVar6 * (long)iVar7;
    uVar9 = SUB168(SEXT816(lVar8) * SEXT816(0x2000161c4f46fb7f),8);
  }
  else {
    lVar8 = (long)(this->S).r[1] * (long)(this->P).a[0];
    auVar2 = SEXT816(lVar8) * SEXT816(0x2000161c4f46fb7f);
    iVar4 = (((int)(auVar2._8_8_ >> 0x1c) - (auVar2._12_4_ >> 0x1f)) * 0x7fffa78f - (int)lVar8) +
            (this->S).r[0];
    iVar5 = iVar4 + 0x7fffa78f;
    if (-1 < iVar4) {
      iVar5 = iVar4;
    }
    lVar8 = (long)(this->S).r[2] * (long)(this->P).a[1];
    auVar2 = SEXT816(lVar8) * SEXT816(0x2000161c4f46fb7f);
    iVar5 = (((int)(auVar2._8_8_ >> 0x1c) - (auVar2._12_4_ >> 0x1f)) * 0x7fffa78f - (int)lVar8) +
            iVar5;
    iVar4 = iVar5 + 0x7fffa78f;
    if (-1 < iVar5) {
      iVar4 = iVar5;
    }
    lVar8 = (long)(this->S).r[3] * (long)(this->P).a[2];
    auVar2 = SEXT816(lVar8) * SEXT816(0x2000161c4f46fb7f);
    iVar4 = (((int)(auVar2._8_8_ >> 0x1c) - (auVar2._12_4_ >> 0x1f)) * 0x7fffa78f - (int)lVar8) +
            iVar4;
    iVar5 = iVar4 + 0x7fffa78f;
    if (-1 < iVar4) {
      iVar5 = iVar4;
    }
    iVar4 = (this->P).a[3];
    iVar1 = (this->S).r[4];
LAB_00204dc2:
    auVar2 = SEXT816((long)iVar1 * (long)iVar4) * SEXT816(0x2000161c4f46fb7f);
    iVar5 = (((int)(auVar2._8_8_ >> 0x1c) - (auVar2._12_4_ >> 0x1f)) * 0x7fffa78f -
            (int)((long)iVar1 * (long)iVar4)) + iVar5;
LAB_00204de7:
    iVar4 = iVar5 + 0x7fffa78f;
    if (-1 < iVar5) {
      iVar4 = iVar5;
    }
    iVar6 = int_math::modulo_inverse(iVar7,0x7fffa78f);
    lVar8 = (long)iVar6 * (long)iVar4;
    uVar9 = SUB168(SEXT816(lVar8) * SEXT816(0x2000161c4f46fb7f),8);
  }
  iVar7 = (int)lVar8 + ((int)(uVar9 >> 0x1c) - (int)((long)uVar9 >> 0x3f)) * -0x7fffa78f;
LAB_00204e1b:
  uVar3 = *(undefined8 *)((this->S).r + 3);
  *(undefined8 *)(this->S).r = *(undefined8 *)((this->S).r + 1);
  *(undefined8 *)((this->S).r + 2) = uVar3;
  (this->S).r[4] = iVar7;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg5s::backward() {
    result_type t;
    if (P.a[4] != 0) {
      t = S.r[0];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[1])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[2]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[3]) * static_cast<int64_t>(S.r[4])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[4], modulus))) %
          modulus);
    } else if (P.a[3] != 0) {
      t = S.r[0];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[1])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[2]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[3], modulus))) %
          modulus);
    } else if (P.a[2] != 0) {
      t = S.r[1];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[2], modulus))) %
          modulus);
    } else if (P.a[1] != 0) {
      t = S.r[2];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[1], modulus))) %
          modulus);
    } else if (P.a[0] != 0) {
      t = S.r[3];
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[0], modulus))) %
          modulus);
    } else
      t = 0;
    S.r[0] = S.r[1];
    S.r[1] = S.r[2];
    S.r[2] = S.r[3];
    S.r[3] = S.r[4];
    S.r[4] = t;
  }